

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

ON_ModelComponentReference __thiscall
ONX_Model::LinePatternFromAttributes(ONX_Model *this,ON_3dmObjectAttributes *attributes)

{
  object_linetype_source oVar1;
  ON_ModelComponent *p;
  ON_Layer *this_00;
  ON_3dmObjectAttributes *in_RDX;
  ON_ModelComponentReference OVar2;
  undefined1 local_40 [24];
  ON_Layer *layer;
  ON_wString OStack_20;
  int line_pattern_index;
  ON_3dmObjectAttributes *attributes_local;
  ONX_Model *this_local;
  
  OStack_20.m_s = (wchar_t *)in_RDX;
  attributes_local = attributes;
  this_local = this;
  layer._4_4_ = ON_ModelComponent::Index(&ON_Linetype::Continuous.super_ON_ModelComponent);
  oVar1 = ON_3dmObjectAttributes::LinetypeSource((ON_3dmObjectAttributes *)OStack_20.m_s);
  if (oVar1 == linetype_from_layer) {
    if (-1 < OStack_20.m_s[0xc]) {
      LayerFromIndex((ONX_Model *)local_40,(int)attributes);
      p = ON_ModelComponentReference::ModelComponent((ON_ModelComponentReference *)local_40);
      this_00 = ON_Layer::Cast(&p->super_ON_Object);
      ON_ModelComponentReference::~ON_ModelComponentReference
                ((ON_ModelComponentReference *)local_40);
      local_40._16_8_ = this_00;
      if (this_00 != (ON_Layer *)0x0) {
        layer._4_4_ = ON_Layer::LinetypeIndex(this_00);
      }
    }
  }
  else if (oVar1 == linetype_from_object) {
    layer._4_4_ = OStack_20.m_s[0xd];
  }
  else if (oVar1 == linetype_from_parent) {
    layer._4_4_ = OStack_20.m_s[0xd];
  }
  OVar2 = LinePatternFromIndex(this,(int)attributes);
  OVar2.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar2.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::LinePatternFromAttributes(
  const ON_3dmObjectAttributes& attributes
  ) const
{
  int line_pattern_index = ON_Linetype::Continuous.Index();

  switch ( attributes.LinetypeSource() )
  {
  case ON::linetype_from_layer:
    if (attributes.m_layer_index >= 0)
    {
      const ON_Layer* layer = ON_Layer::Cast(LayerFromIndex(attributes.m_layer_index).ModelComponent());
      if ( nullptr != layer )
        line_pattern_index = layer->LinetypeIndex();
    }
    break;
  case ON::linetype_from_object:
    line_pattern_index = attributes.m_linetype_index;
    break;
  case ON::linetype_from_parent:
    line_pattern_index = attributes.m_linetype_index;
    // TODO: if object is an instance definition, get linetype
    //       from instance references.
    break;
  }

  return LinePatternFromIndex(line_pattern_index);
}